

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_xinput2.c
# Opt level: O0

int dequeue_event(ManyMouseEvent *event)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  ManyMouseEvent *event_local;
  
  bVar4 = input_events_read != input_events_write;
  if (bVar4) {
    lVar3 = (long)input_events_read;
    uVar1 = input_events[lVar3].device;
    event->type = input_events[lVar3].type;
    event->device = uVar1;
    iVar2 = input_events[lVar3].value;
    event->item = input_events[lVar3].item;
    event->value = iVar2;
    iVar2 = input_events[lVar3].maxval;
    event->minval = input_events[lVar3].minval;
    event->maxval = iVar2;
    input_events_read = (input_events_read + 1) % 0x400;
  }
  event_local._4_4_ = (uint)bVar4;
  return event_local._4_4_;
}

Assistant:

static int dequeue_event(ManyMouseEvent *event)
{
    if (input_events_read != input_events_write)  /* no events if equal. */
    {
        memcpy(event, &input_events[input_events_read], sizeof (*event));
        input_events_read = ((input_events_read + 1) % MAX_EVENTS);
        return 1;
    } /* if */
    return 0;  /* no event. */
}